

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O0

bool __thiscall booster::fork_shared_mutex::try_unique_lock(fork_shared_mutex *this)

{
  int iVar1;
  pthread_rwlock_t *ppVar2;
  data *pdVar3;
  int *piVar4;
  undefined8 uVar5;
  error_category *in_RDI;
  int err;
  int res;
  flock lock;
  uint in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffbc;
  system_error *in_stack_ffffffffffffffc0;
  undefined2 local_30;
  undefined2 local_2e;
  bool local_1;
  
  ppVar2 = (pthread_rwlock_t *)
           hold_ptr<booster::fork_shared_mutex::data>::operator->
                     ((hold_ptr<booster::fork_shared_mutex::data> *)in_RDI);
  iVar1 = pthread_rwlock_trywrlock(ppVar2);
  if (iVar1 == 0) {
    memset(&local_30,0,0x20);
    local_30 = 1;
    local_2e = 0;
    do {
      pdVar3 = hold_ptr<booster::fork_shared_mutex::data>::operator->
                         ((hold_ptr<booster::fork_shared_mutex::data> *)in_RDI);
      iVar1 = fileno((FILE *)pdVar3->lock_file);
      iVar1 = fcntl(iVar1,6,&local_30);
      in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
      if (iVar1 != 0) {
        piVar4 = __errno_location();
        in_stack_ffffffffffffffac = CONCAT13(*piVar4 == 4,(int3)in_stack_ffffffffffffffac);
      }
    } while ((char)(in_stack_ffffffffffffffac >> 0x18) != '\0');
    if (iVar1 == 0) {
      local_1 = true;
    }
    else {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      ppVar2 = (pthread_rwlock_t *)
               hold_ptr<booster::fork_shared_mutex::data>::operator->
                         ((hold_ptr<booster::fork_shared_mutex::data> *)in_RDI);
      pthread_rwlock_unlock(ppVar2);
      if ((iVar1 != 0xd) && (iVar1 != 0xb)) {
        uVar5 = __cxa_allocate_exception(0x40);
        std::_V2::system_category();
        system::system_error::system_error
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_RDI,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,iVar1));
        __cxa_throw(uVar5,&system::system_error::typeinfo,system::system_error::~system_error);
      }
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool fork_shared_mutex::try_unique_lock()
	{
		if(pthread_rwlock_trywrlock(&d->lock)!=0)
			return false;
		struct flock lock;
		memset(&lock,0,sizeof(lock));
		lock.l_type=F_WRLCK;
		lock.l_whence=SEEK_SET;
		int res = 0;
		while((res = ::fcntl(fileno(d->lock_file),F_SETLK,&lock))!=0 && errno==EINTR)
			;
		if(res == 0)
			return true;
		int err = errno;
		pthread_rwlock_unlock(&d->lock);
		if(err == EACCES || err==EAGAIN)
			return false;
		throw system::system_error(err,system::system_category(),"fork_shared_mutex: failed to lock");
	}